

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O0

int IMU_JY61::uart_open(int fd,char *pathname)

{
  int iVar1;
  char *pathname_local;
  int fd_local;
  
  pathname_local._4_4_ = open(pathname,0x102);
  if (pathname_local._4_4_ == -1) {
    perror("Can\'t Open Serial Port");
    pathname_local._4_4_ = -1;
  }
  else {
    printf("open %s success!\n",pathname);
    iVar1 = isatty(0);
    if (iVar1 == 0) {
      printf("standard input is not a terminal device\n");
    }
    else {
      printf("isatty success!\n");
    }
  }
  return pathname_local._4_4_;
}

Assistant:

int uart_open(int fd,const char *pathname)
    {
        fd = open(pathname, O_RDWR|O_NOCTTY);
        if (-1 == fd)
        {
            perror("Can't Open Serial Port");
            return(-1);
        }
        else
            printf("open %s success!\n",pathname);
        if(isatty(STDIN_FILENO)==0)
            printf("standard input is not a terminal device\n");
        else
            printf("isatty success!\n");
        return fd;
    }